

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  std::operator+(__return_storage_ptr__,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,
                 "_FIELD_NUMBER");
  UpperString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string name = field->name() + "_FIELD_NUMBER";
  UpperString(&name);
  return name;
}